

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.h
# Opt level: O2

int R_PointOnSide(DVector2 *pos,node_t *node)

{
  long lVar1;
  
  lVar1 = (long)node->dy * ((long)node->x - (long)SUB84(pos->X + 103079215104.0,0)) +
          (long)node->dx * ((long)SUB84(pos->Y + 103079215104.0,0) - (long)node->y);
  return (int)((int)((ulong)lVar1 >> 0x20) != 0 && -1 < lVar1);
}

Assistant:

inline int R_PointOnSide(const DVector2 &pos, const node_t *node)
{
	return DMulScale32(FLOAT2FIXED(pos.Y) - node->y, node->dx, node->x - FLOAT2FIXED(pos.X), node->dy) > 0;
}